

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::GetLineFromStream
               (istream *is,string *line,bool *has_newline,long sizeLimit)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  
  std::__cxx11::string::assign((char *)line);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)line);
    sVar1 = line->_M_string_length;
    if (sVar1 == 0) {
      bVar2 = ((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0;
    }
    else {
      if ((line->_M_dataplus)._M_p[sVar1 - 1] == '\r') {
        std::__cxx11::string::resize((ulong)line);
        sVar1 = line->_M_string_length;
      }
      bVar2 = true;
      if ((-1 < sizeLimit) && ((ulong)sizeLimit <= sVar1)) {
        std::__cxx11::string::resize((ulong)line);
      }
    }
    if (has_newline == (bool *)0x0) {
      return bVar2;
    }
    bVar3 = ((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0;
  }
  else {
    bVar3 = false;
    bVar2 = false;
    if (has_newline == (bool *)0x0) {
      return false;
    }
  }
  *has_newline = bVar3;
  return bVar2;
}

Assistant:

bool SystemTools::GetLineFromStream(std::istream& is, std::string& line,
                                    bool* has_newline /* = 0 */,
                                    long sizeLimit /* = -1 */)
{
  // Start with an empty line.
  line = "";

  // Early short circuit return if stream is no good. Just return
  // false and the empty line. (Probably means caller tried to
  // create a file stream with a non-existent file name...)
  //
  if (!is) {
    if (has_newline) {
      *has_newline = false;
    }
    return false;
  }

  std::getline(is, line);
  bool haveData = !line.empty() || !is.eof();
  if (!line.empty()) {
    // Avoid storing a carriage return character.
    if (line.back() == '\r') {
      line.resize(line.size() - 1);
    }

    // if we read too much then truncate the buffer
    if (sizeLimit >= 0 && line.size() >= static_cast<size_t>(sizeLimit)) {
      line.resize(sizeLimit);
    }
  }

  // Return the results.
  if (has_newline) {
    *has_newline = !is.eof();
  }
  return haveData;
}